

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::drawProgressBarLabel
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *param_4)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  QStyleOptionProgressBar *pQVar4;
  QStyle *pQVar5;
  undefined8 in_RDX;
  QStyleOption *in_RSI;
  long in_FS_OFFSET;
  ColorRole textRole;
  bool vertical;
  QStyleOptionProgressBar *pb;
  undefined8 in_stack_ffffffffffffff78;
  StateFlag other;
  TextFlag in_stack_ffffffffffffff80;
  AlignmentFlag in_stack_ffffffffffffff84;
  QStyle *in_stack_ffffffffffffff90;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_18;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_14;
  long local_10;
  
  other = (StateFlag)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = qstyleoption_cast<QStyleOptionProgressBar_const*>(in_RSI);
  if (pQVar4 != (QStyleOptionProgressBar *)0x0) {
    local_14.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),other);
    bVar1 = QFlags<QStyle::StateFlag>::operator!((QFlags<QStyle::StateFlag> *)&local_14);
    if (!bVar1) {
      pQVar5 = QStyle::proxy(in_stack_ffffffffffffff90);
      iVar2 = Qt::operator|(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      local_18.super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorage<QStyle::StateFlag>)
           QFlags<QStyle::StateFlag>::operator&
                     ((QFlags<QStyle::StateFlag> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),other);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
      (**(code **)(*(long *)pQVar5 + 0x98))
                (pQVar5,in_RDX,&(pQVar4->super_QStyleOption).rect,iVar2,
                 &(pQVar4->super_QStyleOption).palette,IVar3 != 0,&pQVar4->text,8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapStyle::drawProgressBarLabel(const QStyleOption *option,
                                        QPainter *painter, const QWidget *) const
{
    if (const QStyleOptionProgressBar *pb =
                    qstyleoption_cast<const QStyleOptionProgressBar *>(option)) {
        const bool vertical = !(pb->state & QStyle::State_Horizontal);
        if (!vertical) {
            QPalette::ColorRole textRole = QPalette::ButtonText;
            proxy()->drawItemText(painter, pb->rect,
                                  Qt::AlignCenter | Qt::TextSingleLine, pb->palette,
                                  pb->state & State_Enabled, pb->text, textRole);
        }
    }
}